

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x509_cmp.cc
# Opt level: O1

int X509_NAME_cmp(X509_NAME *a,X509_NAME *b)

{
  int iVar1;
  int iVar2;
  
  if ((a->canon_enc == (uchar *)0x0) || (a->modified != 0)) {
    iVar2 = i2d_X509_NAME(a,(uchar **)0x0);
    if (-1 < iVar2) goto LAB_004b4e4c;
LAB_004b4e8e:
    iVar2 = -2;
  }
  else {
LAB_004b4e4c:
    if ((b->canon_enc == (uchar *)0x0) || (b->modified != 0)) {
      iVar2 = i2d_X509_NAME(b,(uchar **)0x0);
      if (iVar2 < 0) goto LAB_004b4e8e;
    }
    iVar1 = a->canon_enclen;
    iVar2 = iVar1 - b->canon_enclen;
    if (iVar2 == 0) {
      if (iVar1 != 0) {
        iVar2 = memcmp(a->canon_enc,b->canon_enc,(long)iVar1);
        return iVar2;
      }
      iVar2 = 0;
    }
  }
  return iVar2;
}

Assistant:

int X509_NAME_cmp(const X509_NAME *a, const X509_NAME *b) {
  int ret;

  // Ensure canonical encoding is present and up to date

  if (!a->canon_enc || a->modified) {
    ret = i2d_X509_NAME((X509_NAME *)a, NULL);
    if (ret < 0) {
      return -2;
    }
  }

  if (!b->canon_enc || b->modified) {
    ret = i2d_X509_NAME((X509_NAME *)b, NULL);
    if (ret < 0) {
      return -2;
    }
  }

  ret = a->canon_enclen - b->canon_enclen;

  if (ret) {
    return ret;
  }

  return OPENSSL_memcmp(a->canon_enc, b->canon_enc, a->canon_enclen);
}